

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

void helics::integerExtractAndConvert
               (defV *store,data_view *dv,shared_ptr<units::precise_unit> *inputUnits,
               shared_ptr<units::precise_unit> *outputUnits)

{
  bool bVar1;
  double *__rhs;
  __shared_ptr *in_RCX;
  __shared_ptr *in_RDX;
  __shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  long V;
  precise_unit *in_stack_000000a8;
  precise_unit *in_stack_000000b0;
  double in_stack_000000b8;
  data_view *in_stack_ffffffffffffffc0;
  
  __rhs = (double *)ValueConverter<long>::interpret(in_stack_ffffffffffffffc0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDX);
  if ((bVar1) && (bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RCX), bVar1)) {
    this = (__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           (double)(long)__rhs;
    std::__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*(this);
    std::__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*(this);
    ::units::convert<units::precise_unit,units::precise_unit>
              (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                 *)in_RCX,__rhs);
  }
  else {
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                 *)in_RCX,(long *)__rhs);
  }
  return;
}

Assistant:

void integerExtractAndConvert(defV& store,
                              const data_view& dv,
                              const std::shared_ptr<units::precise_unit>& inputUnits,
                              const std::shared_ptr<units::precise_unit>& outputUnits)
{
    auto V = ValueConverter<int64_t>::interpret(dv);
    if ((inputUnits) && (outputUnits)) {
        store = units::convert(static_cast<double>(V), *inputUnits, *outputUnits);
    } else {
        store = V;
    }
}